

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

smap * units::loadDefinedUnits_abi_cxx11_(void)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  smap *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>,_bool>
  pVar4;
  value_type *pr_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  array<std::pair<const_char_*,_units::precise_unit>,_66UL> *__range1_2;
  value_type *pr_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<std::pair<const_char_*,_units::precise_unit>,_1169UL> *__range1_1;
  value_type *pr;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_units::precise_unit>,_1211UL> *__range1;
  smap *knownUnits;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  const_iterator local_90;
  const_iterator local_60;
  const_iterator local_20;
  
  memset(in_RDI,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                   *)0x6b725a);
  local_20 = std::array<std::pair<const_char_*,_units::precise_unit>,_1211UL>::begin
                       ((array<std::pair<const_char_*,_units::precise_unit>,_1211UL> *)0x6b7275);
  pvVar1 = std::array<std::pair<const_char_*,_units::precise_unit>,_1211UL>::end
                     ((array<std::pair<const_char_*,_units::precise_unit>,_1211UL> *)0x6b7289);
  for (; local_20 != pvVar1; local_20 = local_20 + 1) {
    if (local_20->first != (char *)0x0) {
      std::
      unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
      ::emplace<char_const*const&,units::precise_unit_const&>
                ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 (char **)in_stack_ffffffffffffff18._M_cur,
                 (precise_unit *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    }
  }
  local_60 = std::array<std::pair<const_char_*,_units::precise_unit>,_1169UL>::begin
                       ((array<std::pair<const_char_*,_units::precise_unit>,_1169UL> *)0x6b735c);
  pvVar2 = std::array<std::pair<const_char_*,_units::precise_unit>,_1169UL>::end
                     ((array<std::pair<const_char_*,_units::precise_unit>,_1169UL> *)0x6b7370);
  for (; local_60 != pvVar2; local_60 = local_60 + 1) {
    if (local_60->first != (char *)0x0) {
      pVar4 = std::
              unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
              ::emplace<char_const*const&,units::precise_unit_const&>
                        ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                         (char **)in_stack_ffffffffffffff18._M_cur,
                         (precise_unit *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      in_stack_ffffffffffffff27 = pVar4.second;
    }
  }
  local_90 = std::array<std::pair<const_char_*,_units::precise_unit>,_66UL>::begin
                       ((array<std::pair<const_char_*,_units::precise_unit>,_66UL> *)0x6b7414);
  pvVar3 = std::array<std::pair<const_char_*,_units::precise_unit>,_66UL>::end
                     ((array<std::pair<const_char_*,_units::precise_unit>,_66UL> *)0x6b7425);
  for (; local_90 != pvVar3; local_90 = local_90 + 1) {
    if (local_90->first != (char *)0x0) {
      pVar4 = std::
              unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
              ::emplace<char_const*const&,units::precise_unit_const&>
                        ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                         (char **)in_stack_ffffffffffffff18._M_cur,
                         (precise_unit *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      in_stack_ffffffffffffff18._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
           ._M_cur;
      in_stack_ffffffffffffff17 = pVar4.second;
    }
  }
  return in_RDI;
}

Assistant:

static smap loadDefinedUnits()
{
    smap knownUnits{};
    for (const auto& pr : defined_unit_strings_si) {
        if (pr.first != nullptr) {
            knownUnits.emplace(pr.first, pr.second);
        }
    }
    for (const auto& pr : defined_unit_strings_customary) {
        if (pr.first != nullptr) {
            knownUnits.emplace(pr.first, pr.second);
        }
    }
#if !defined(UNITS_DISABLE_NON_ENGLISH_UNITS) ||                               \
    UNITS_DISABLE_NON_ENGLISH_UNITS == 0
    for (const auto& pr : defined_unit_strings_non_english) {
        if (pr.first != nullptr) {
            knownUnits.emplace(pr.first, pr.second);
        }
    }
#endif
    return knownUnits;
}